

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

short __thiscall xercesc_4_0::DOMNodeImpl::compareDocumentPosition(DOMNodeImpl *this,DOMNode *other)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  DOMNode *pDVar5;
  DOMNode *pDVar6;
  DOMNode *pDVar7;
  DOMNode *pDVar8;
  undefined4 extraout_var;
  int iVar9;
  DOMNodeImpl *this_00;
  DOMNode *node;
  int iVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  
  pDVar7 = this->fContainingNode;
  if ((pDVar7 == other) || (iVar2 = (*pDVar7->_vptr_DOMNode[4])(pDVar7), 0xc < iVar2)) {
    sVar1 = 0;
  }
  else {
    this_00 = (DOMNodeImpl *)other;
    iVar2 = (*other->_vptr_DOMNode[4])();
    if (0xc < iVar2) {
      iVar2 = (*other->_vptr_DOMNode[0x20])(other,pDVar7);
      sVar1 = reverseTreeOrderBitPattern((DOMNodeImpl *)other,(short)iVar2);
      return sVar1;
    }
    iVar2 = 0;
    pDVar8 = this->fContainingNode;
    while (pDVar5 = getTreeParentNode(this_00,pDVar8), pDVar5 != (DOMNode *)0x0) {
      if (pDVar5 == other) {
        return 10;
      }
      iVar2 = iVar2 + -1;
      pDVar8 = pDVar5;
    }
    iVar10 = 0;
    pDVar5 = other;
    while (pDVar6 = getTreeParentNode(this_00,pDVar5), pDVar6 != (DOMNode *)0x0) {
      if (pDVar6 == pDVar7) {
        return 0x14;
      }
      iVar10 = iVar10 + -1;
      pDVar5 = pDVar6;
    }
    if (pDVar8 == pDVar5) {
      pDVar7 = this->fContainingNode;
      if ((uint)-iVar10 < (uint)-iVar2) {
        iVar9 = 0;
        if (0 < iVar10 - iVar2) {
          iVar9 = iVar10 - iVar2;
        }
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, pDVar8 = other, pDVar5 = pDVar7, bVar11) {
          pDVar7 = getTreeParentNode(this_00,pDVar7);
        }
      }
      else {
        iVar9 = 0;
        if (0 < iVar2 - iVar10) {
          iVar9 = iVar2 - iVar10;
        }
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, pDVar8 = other, pDVar5 = pDVar7, bVar11) {
          other = getTreeParentNode(this_00,other);
        }
      }
      while (node = pDVar5, pDVar6 = pDVar8, node != pDVar6) {
        pDVar5 = getTreeParentNode(this_00,node);
        pDVar8 = getTreeParentNode(this_00,pDVar6);
        other = pDVar6;
        pDVar7 = node;
      }
      uVar3 = (*pDVar7->_vptr_DOMNode[4])(pDVar7);
      uVar4 = (*other->_vptr_DOMNode[4])(other);
      bVar11 = (uVar3 & 0xfffb) == 2;
      bVar12 = (uVar3 & 0xffff) == 0xc;
      bVar13 = (uVar4 & 0xfffb) != 2;
      bVar14 = (uVar4 & 0xffff) != 0xc;
      if ((bVar12 || bVar11) || (!bVar14 || !bVar13)) {
        sVar1 = 4;
        if ((!bVar12 && !bVar11 || (!bVar14 || !bVar13)) &&
           (sVar1 = 2, (bVar12 || bVar11) || bVar14 && bVar13)) {
          if ((short)uVar3 == (short)uVar4) {
            sVar1 = (ushort)(pDVar7 < other) * 2 + 0x22;
          }
          else {
            sVar1 = (ushort)((short)uVar3 < (short)uVar4) * 2 + 2;
          }
        }
      }
      else {
        do {
          if (pDVar7 == (DOMNode *)0x0) {
            return 2;
          }
          iVar2 = (*pDVar7->_vptr_DOMNode[10])(pDVar7);
          pDVar7 = (DOMNode *)CONCAT44(extraout_var,iVar2);
          sVar1 = 4;
        } while (pDVar7 != other);
      }
    }
    else {
      sVar1 = (ushort)(pDVar5 <= pDVar8) * 2 + 0x23;
    }
  }
  return sVar1;
}

Assistant:

const DOMNode* DOMNodeImpl::getContainingNode() const {
    return fContainingNode;
}